

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_arrowhead.cpp
# Opt level: O3

uint __thiscall agg::arrowhead::vertex(arrowhead *this,double *x,double *y)

{
  uint uVar1;
  
  uVar1 = 0;
  if (this->m_curr_id < 2) {
    uVar1 = this->m_curr_coord;
    *x = this->m_coord[uVar1 * 2];
    *y = this->m_coord[(ulong)(uVar1 * 2) + 1];
    this->m_curr_coord = uVar1 + 1;
    uVar1 = this->m_cmd[uVar1];
  }
  return uVar1;
}

Assistant:

unsigned arrowhead::vertex(double* x, double* y)
    {
        if(m_curr_id < 2)
        {
            unsigned curr_idx = m_curr_coord * 2;
            *x = m_coord[curr_idx];
            *y = m_coord[curr_idx + 1];
            return m_cmd[m_curr_coord++];
        }
        return path_cmd_stop;
    }